

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueries
          (TextureFilterMinmaxParameterQueriesTestCase *this,Functions *gl,GLint pname)

{
  RenderContext *pRVar1;
  SupportedTextureType *pSVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  ObjectWrapper *this_00;
  undefined4 extraout_var;
  ObjectTraits *traits;
  Texture2D *this_01;
  pointer pSVar6;
  pointer pSVar7;
  pointer ppSVar8;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  GLint local_4c;
  RenderContext *local_48;
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  local_40;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_4c = pname;
  this_00 = (ObjectWrapper *)operator_new(0x18);
  local_48 = pRVar1;
  iVar4 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  traits = glu::objectTraits(OBJECTTYPE_SAMPLER);
  glu::ObjectWrapper::ObjectWrapper(this_00,(Functions *)CONCAT44(extraout_var,iVar4),traits);
  local_40.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)7> *)this_00;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glu::Sampler error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x24e);
  (*gl->samplerParameteri)(*(deUint32 *)((long)local_40.m_data.ptr + 0x10),0x9366,local_4c);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"samplerParameteri error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x251);
  ppSVar8 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar8 !=
      (this->m_utils).m_supportedTextureTypes.
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar2 = *ppSVar8;
      (*gl->texParameteriv)(pSVar2->m_type,0x9366,&local_4c);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"texParameteriv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x259);
      (*gl->texParameterIiv)(pSVar2->m_type,0x9366,&local_4c);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"texParameterIiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x25c);
      ppSVar8 = ppSVar8 + 1;
    } while (ppSVar8 !=
             (this->m_utils).m_supportedTextureTypes.
             super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_ES3_1_compatibility")
  ;
  pSVar7 = (this->m_utils).m_supportedTextureDataTypes.
           super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (this->m_utils).m_supportedTextureDataTypes.
           super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar7 != pSVar6) {
    do {
      if ((byte)(~bVar3 & ((byte)pSVar7->m_testFlags & 2) >> 1) == 0) {
        this_01 = (Texture2D *)operator_new(0x70);
        glu::Texture2D::Texture2D(this_01,local_48,pSVar7->m_format,pSVar7->m_type,0x20,0x20);
        (*this_01->_vptr_Texture2D[2])(this_01);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glu::Texture2D error occurred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                        ,0x26a);
        (*gl->textureParameteriv)(this_01->m_glTexture,0x9366,&local_4c);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"textureParameteriv error occurred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                        ,0x26d);
        (*gl->textureParameterIiv)(this_01->m_glTexture,0x9366,&local_4c);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"textureParameterIiv error occurred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                        ,0x270);
        (*this_01->_vptr_Texture2D[1])(this_01);
        pSVar6 = (this->m_utils).m_supportedTextureDataTypes.
                 super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar6);
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::reset(&local_40);
  return;
}

Assistant:

void TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueries(const glw::Functions& gl, glw::GLint pname)
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	de::MovePtr<glu::Sampler> sampler		= de::MovePtr<glu::Sampler>(new glu::Sampler(renderContext));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Sampler error occurred");

	gl.samplerParameteri(**sampler, GL_TEXTURE_REDUCTION_MODE_ARB, pname);
	GLU_EXPECT_NO_ERROR(gl.getError(), "samplerParameteri error occurred");

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter iter = m_utils.getSupportedTextureTypes().begin();
		 iter != m_utils.getSupportedTextureTypes().end(); ++iter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *iter;

		gl.texParameteriv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteriv error occurred");

		gl.texParameterIiv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texParameterIiv error occurred");
	}

	bool is_arb_es31_compatibility = m_context.getContextInfo().isExtensionSupported("GL_ARB_ES3_1_compatibility");

	for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter iter = m_utils.getSupportedTextureDataTypes().begin();
		 iter != m_utils.getSupportedTextureDataTypes().end(); ++iter)
	{
		if (iter->hasFlag(TextureFilterMinmaxUtils::COMPATIBILITY) && !is_arb_es31_compatibility)
			continue;

		de::MovePtr<glu::Texture2D> texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(
			renderContext, iter->m_format, iter->m_type, TEXTURE_FILTER_MINMAX_SIZE, TEXTURE_FILTER_MINMAX_SIZE));
		texture->upload();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

		gl.textureParameteriv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "textureParameteriv error occurred");

		gl.textureParameterIiv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "textureParameterIiv error occurred");
	}
}